

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::
strTree<char_const(&)[65],kj::CappedArray<char,17ul>&,char_const(&)[6],kj::StringTree,char_const(&)[3]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [65],
          CappedArray<char,_17UL> *params_1,char (*params_2) [6],StringTree *params_3,
          char (*params_4) [3])

{
  undefined1 local_70 [24];
  ArrayDisposer *local_58;
  ArrayPtr<const_char> local_50;
  kj *local_40;
  char *local_38;
  
  local_38 = (char *)strlen((char *)this);
  local_50.size_ = *(size_t *)*params;
  local_50.ptr = *params + 8;
  local_40 = this;
  local_58 = (ArrayDisposer *)strlen((char *)params_1);
  local_70._16_8_ = params_1;
  local_70._8_8_ = strlen((char *)params_3);
  local_70._0_8_ = params_3;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_40,&local_50,
             (ArrayPtr<const_char> *)(local_70 + 0x10),(ArrayPtr<const_char> *)params_2,
             (StringTree *)local_70,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}